

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O3

void __thiscall
amrex::MFNodeBilinear::interp
          (MFNodeBilinear *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *param_7,Geometry *param_8,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  MFIter mfi;
  ulong local_220;
  long local_218;
  long local_208;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)finemf,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&finemf->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&crsemf->super_FabArray<amrex::FArrayBox>,&local_90);
      BATransformer::operator()
                (&local_12c,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      uVar13 = local_12c.smallend.vect[2] - ng->vect[2];
      uVar18 = ng->vect[2] + local_12c.bigend.vect[2];
      uVar2 = (dest_domain->smallend).vect[2];
      if ((int)uVar13 <= (int)uVar2) {
        uVar13 = uVar2;
      }
      uVar2 = (dest_domain->bigend).vect[2];
      if ((int)uVar2 <= (int)uVar18) {
        uVar18 = uVar2;
      }
      if (0 < nc) {
        uVar2 = (dest_domain->smallend).vect[0];
        iVar22 = (dest_domain->smallend).vect[1];
        uVar23 = (dest_domain->bigend).vect[0];
        iVar3 = (dest_domain->bigend).vect[1];
        iVar4 = ratio->vect[0];
        iVar24 = local_12c.smallend.vect[1] - ng->vect[1];
        iVar28 = ng->vect[1] + local_12c.bigend.vect[1];
        iVar5 = ratio->vect[1];
        if (iVar3 <= iVar28) {
          iVar28 = iVar3;
        }
        iVar3 = ratio->vect[2];
        uVar21 = local_12c.smallend.vect[0] - ng->vect[0];
        uVar26 = ng->vect[0] + local_12c.bigend.vect[0];
        if ((int)uVar23 <= (int)uVar26) {
          uVar26 = uVar23;
        }
        if (iVar24 <= iVar22) {
          iVar24 = iVar22;
        }
        if ((int)uVar21 <= (int)uVar2) {
          uVar21 = uVar2;
        }
        dVar36 = 1.0 / (double)iVar4;
        dVar37 = 1.0 / (double)iVar5;
        dVar34 = 1.0 / (double)iVar3;
        local_218 = (long)fcomp * 8 * local_d0.nstride +
                    ((long)iVar24 - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                    (long)(int)uVar21 * 8 + (long)local_d0.begin.x * -8 + (long)local_d0.p;
        local_220 = 0;
        do {
          if ((int)uVar13 <= (int)uVar18) {
            lVar7 = ((long)ccomp + local_220) * local_110.nstride;
            uVar2 = uVar13;
            do {
              if (iVar24 <= iVar28) {
                local_208 = ((long)(int)uVar2 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                            local_218;
                uVar32 = (long)iVar24;
                do {
                  if ((int)uVar21 <= (int)uVar26) {
                    uVar31 = (uint)uVar32;
                    lVar12 = 0;
                    uVar23 = ~uVar21;
                    do {
                      uVar1 = (int)uVar21 + lVar12;
                      uVar29 = (uint)uVar1;
                      if (iVar4 == 4) {
                        if ((long)uVar1 < 0) {
                          uVar27 = (int)uVar29 >> 2;
                        }
                        else {
                          uVar27 = uVar29 >> 2;
                        }
                      }
                      else if (iVar4 == 2) {
                        if ((long)uVar1 < 0) {
                          uVar27 = (int)uVar29 >> 1;
                        }
                        else {
                          uVar27 = uVar29 >> 1;
                        }
                      }
                      else {
                        uVar27 = uVar29;
                        if (iVar4 != 1) {
                          if ((long)uVar1 < 0) {
                            uVar27 = ~((int)uVar23 / iVar4);
                          }
                          else {
                            uVar27 = (uint)((long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 |
                                                  uVar1 & 0xffffffff) / (long)iVar4);
                          }
                        }
                      }
                      uVar9 = uVar31;
                      if (((iVar5 != 1) && (uVar9 = (int)uVar31 >> 2, iVar5 != 4)) &&
                         (uVar9 = (int)uVar31 >> 1, iVar5 != 2)) {
                        if ((long)uVar32 < 0) {
                          uVar9 = ~((int)~uVar31 / iVar5);
                        }
                        else {
                          uVar9 = (uint)((long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 |
                                               uVar32 & 0xffffffff) / (long)iVar5);
                        }
                      }
                      uVar6 = uVar2;
                      if (((iVar3 != 1) && (uVar6 = (int)uVar2 >> 2, iVar3 != 4)) &&
                         (uVar6 = (int)uVar2 >> 1, iVar3 != 2)) {
                        if ((int)uVar2 < 0) {
                          uVar6 = ~((int)~uVar2 / iVar3);
                        }
                        else {
                          uVar6 = (int)uVar2 / iVar3;
                        }
                      }
                      uVar19 = uVar27 * iVar4;
                      iVar30 = -iVar4 * uVar27 + uVar29;
                      uVar16 = uVar9 * iVar5;
                      uVar14 = uVar6 * iVar3;
                      iVar22 = uVar2 - uVar14;
                      iVar25 = uVar31 - uVar16;
                      if ((iVar25 == 0 || uVar29 == uVar19) || (uVar2 == uVar14)) {
                        if ((uVar31 == uVar16) || (uVar2 == uVar14)) {
                          if ((uVar29 == uVar19) || (uVar2 == uVar14)) {
                            if (iVar25 == 0 || uVar29 == uVar19) {
                              if (uVar29 == uVar19) {
                                if (uVar31 == uVar16) {
                                  if (uVar2 == uVar14) {
                                    dVar35 = local_110.p
                                             [(int)(uVar9 - local_110.begin.y) * local_110.jstride +
                                              (long)(int)(uVar27 - local_110.begin.x) +
                                              (int)(uVar6 - local_110.begin.z) * local_110.kstride +
                                              lVar7];
                                  }
                                  else {
                                    lVar8 = (int)(uVar9 - local_110.begin.y) * local_110.jstride;
                                    dVar35 = ((double)(iVar3 - iVar22) *
                                              local_110.p
                                              [lVar8 + (long)(int)(uVar27 - local_110.begin.x) +
                                                       local_110.kstride *
                                                       (int)(uVar6 - local_110.begin.z) + lVar7] +
                                             (double)iVar22 *
                                             local_110.p
                                             [lVar8 + (long)(int)(uVar27 - local_110.begin.x) +
                                                      (int)((uVar6 - local_110.begin.z) + 1) *
                                                      local_110.kstride + lVar7]) * dVar34;
                                  }
                                }
                                else {
                                  lVar8 = (int)(uVar6 - local_110.begin.z) * local_110.kstride;
                                  dVar35 = ((double)(iVar5 - iVar25) *
                                            local_110.p
                                            [local_110.jstride * (int)(uVar9 - local_110.begin.y) +
                                             (long)(int)(uVar27 - local_110.begin.x) + lVar8 + lVar7
                                            ] + (double)iVar25 *
                                                local_110.p
                                                [(int)((uVar9 - local_110.begin.y) + 1) *
                                                 local_110.jstride +
                                                 (long)(int)(uVar27 - local_110.begin.x) +
                                                 lVar8 + lVar7]) * dVar37;
                                }
                              }
                              else {
                                lVar10 = (int)(uVar9 - local_110.begin.y) * local_110.jstride;
                                lVar8 = (int)(uVar6 - local_110.begin.z) * local_110.kstride;
                                dVar35 = ((double)(int)((uVar27 + 1) * iVar4 + uVar23 + 1) *
                                          local_110.p
                                          [lVar10 + (long)(int)(uVar27 - local_110.begin.x) +
                                                    lVar8 + lVar7] +
                                         (double)iVar30 *
                                         local_110.p
                                         [lVar10 + (long)(int)((uVar27 - local_110.begin.x) + 1) +
                                                   lVar8 + lVar7]) * dVar36;
                              }
                            }
                            else {
                              iVar22 = uVar27 - local_110.begin.x;
                              lVar10 = local_110.jstride * (int)(uVar9 - local_110.begin.y);
                              lVar8 = (int)(uVar6 - local_110.begin.z) * local_110.kstride;
                              dVar35 = (double)(int)(uVar23 + (uVar27 + 1) * iVar4 + 1);
                              lVar11 = (int)((uVar9 - local_110.begin.y) + 1) * local_110.jstride;
                              dVar35 = ((double)iVar30 *
                                        local_110.p[lVar11 + (long)(iVar22 + 1) + lVar8 + lVar7] *
                                        (double)iVar25 +
                                       dVar35 * local_110.p[lVar11 + (long)iVar22 + lVar8 + lVar7] *
                                       (double)iVar25 +
                                       local_110.p[lVar10 + (long)iVar22 + lVar8 + lVar7] * dVar35 *
                                       (double)(iVar5 - iVar25) +
                                       local_110.p[lVar10 + (long)(iVar22 + 1) + lVar8 + lVar7] *
                                       (double)iVar30 * (double)(iVar5 - iVar25)) * dVar36 * dVar37;
                            }
                          }
                          else {
                            iVar25 = uVar27 - local_110.begin.x;
                            lVar10 = (int)(uVar9 - local_110.begin.y) * local_110.jstride;
                            lVar11 = local_110.kstride * (int)(uVar6 - local_110.begin.z);
                            dVar35 = (double)(int)((uVar27 + 1) * iVar4 + uVar23 + 1);
                            lVar8 = (int)((uVar6 - local_110.begin.z) + 1) * local_110.kstride;
                            dVar35 = ((double)iVar30 *
                                      local_110.p[lVar10 + (long)(iVar25 + 1) + lVar8 + lVar7] *
                                      (double)iVar22 +
                                     dVar35 * local_110.p[lVar10 + (long)iVar25 + lVar8 + lVar7] *
                                     (double)iVar22 +
                                     local_110.p[lVar10 + (long)iVar25 + lVar11 + lVar7] * dVar35 *
                                     (double)(iVar3 - iVar22) +
                                     local_110.p[lVar10 + (long)(iVar25 + 1) + lVar11 + lVar7] *
                                     (double)iVar30 * (double)(iVar3 - iVar22)) * dVar36 * dVar34;
                          }
                        }
                        else {
                          lVar11 = (long)(int)(uVar27 - local_110.begin.x);
                          lVar10 = local_110.jstride * (int)(uVar9 - local_110.begin.y);
                          lVar17 = local_110.kstride * (int)(uVar6 - local_110.begin.z);
                          lVar15 = (int)((uVar9 - local_110.begin.y) + 1) * local_110.jstride;
                          lVar8 = (int)((uVar6 - local_110.begin.z) + 1) * local_110.kstride;
                          dVar35 = ((double)iVar25 * local_110.p[lVar15 + lVar11 + lVar8 + lVar7] *
                                    (double)iVar22 +
                                   (double)(iVar5 - iVar25) *
                                   local_110.p[lVar10 + lVar11 + lVar8 + lVar7] * (double)iVar22 +
                                   local_110.p[lVar10 + lVar11 + lVar17 + lVar7] *
                                   (double)(iVar5 - iVar25) * (double)(iVar3 - iVar22) +
                                   local_110.p[lVar15 + lVar11 + lVar17 + lVar7] * (double)iVar25 *
                                   (double)(iVar3 - iVar22)) * dVar37 * dVar34;
                        }
                      }
                      else {
                        lVar20 = (long)(int)(uVar27 - local_110.begin.x);
                        lVar10 = local_110.jstride * (int)(uVar9 - local_110.begin.y);
                        lVar17 = local_110.kstride * (int)(uVar6 - local_110.begin.z);
                        dVar39 = (double)(int)(uVar23 + (uVar27 + 1) * iVar4 + 1);
                        dVar40 = (double)(iVar5 - iVar25);
                        dVar41 = (double)(iVar3 - iVar22);
                        lVar11 = (long)(int)((uVar27 - local_110.begin.x) + 1);
                        dVar38 = (double)iVar30;
                        lVar15 = (int)((uVar9 - local_110.begin.y) + 1) * local_110.jstride;
                        dVar42 = (double)iVar25;
                        lVar8 = (int)((uVar6 - local_110.begin.z) + 1) * local_110.kstride;
                        dVar35 = (double)iVar22;
                        dVar35 = (dVar38 * local_110.p[lVar15 + lVar11 + lVar8 + lVar7] * dVar42 *
                                  dVar35 + dVar39 * local_110.p[lVar15 + lVar20 + lVar8 + lVar7] *
                                           dVar42 * dVar35 +
                                           local_110.p[lVar10 + lVar11 + lVar8 + lVar7] * dVar38 *
                                           dVar40 * dVar35 +
                                           local_110.p[lVar10 + lVar20 + lVar8 + lVar7] * dVar39 *
                                           dVar40 * dVar35 +
                                           local_110.p[lVar15 + lVar11 + lVar17 + lVar7] * dVar38 *
                                           dVar42 * dVar41 +
                                           local_110.p[lVar15 + lVar20 + lVar17 + lVar7] * dVar39 *
                                           dVar42 * dVar41 +
                                           local_110.p[lVar10 + lVar20 + lVar17 + lVar7] * dVar39 *
                                           dVar40 * dVar41 +
                                           local_110.p[lVar10 + lVar11 + lVar17 + lVar7] * dVar38 *
                                           dVar40 * dVar41) * dVar36 * dVar37 * dVar34;
                      }
                      *(double *)(local_208 + lVar12 * 8) = dVar35;
                      lVar12 = lVar12 + 1;
                      uVar23 = uVar23 - 1;
                    } while (~uVar26 + uVar21 + (int)lVar12 != 0);
                  }
                  uVar32 = uVar32 + 1;
                  local_208 = local_208 + local_d0.jstride * 8;
                } while (iVar28 + 1 != (int)uVar32);
              }
              bVar33 = uVar2 != uVar18;
              uVar2 = uVar2 + 1;
            } while (bVar33);
          }
          local_220 = local_220 + 1;
          local_218 = local_218 + local_d0.nstride * 8;
        } while (local_220 != (uint)nc);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MFNodeBilinear::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                        IntVect const& ng, Geometry const&, Geometry const&,
                        Box const& dest_domain, IntVect const& ratio,
                        Vector<BCRec> const&, int)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                mf_nodebilin_interp(i,j,k,n, fine[box_no], fcomp, crse[box_no], ccomp, ratio);
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            auto const& fine = finemf.array(mfi);
            auto const& crse = crsemf.const_array(mfi);
            Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;
            amrex::LoopConcurrentOnCpu(fbox, nc,
            [=] (int i, int j, int k, int n) noexcept
            {
                mf_nodebilin_interp(i,j,k,n, fine, fcomp, crse, ccomp, ratio);
            });
        }
    }
}